

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_circle_sector_lines
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  int iVar3;
  uchar w;
  uchar z;
  int iVar4;
  uchar x;
  long lVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_78;
  float local_68;
  float fStack_64;
  uchar local_48;
  
  iVar6 = start_angle;
  if (start_angle < end_angle) {
    iVar6 = end_angle;
  }
  fVar9 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar7 = -0.5 / fVar9 + 1.0;
    fVar7 = fVar7 * fVar7;
    fVar7 = acosf(fVar7 + fVar7 + -1.0);
    fVar7 = ceilf(6.2831855 / fVar7);
    iVar3 = (int)((fVar7 * (float)(iVar6 - start_angle)) / 360.0);
    segments = 4;
    if (0 < iVar3) {
      segments = iVar3;
    }
  }
  iVar4 = (iVar6 - start_angle) % 0x168;
  iVar3 = segments * 2 + 4;
  if (iVar4 == 0) {
    iVar3 = segments * 2;
  }
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar5 = prVar1->current_buffer;
  prVar2 = prVar1->vertex_buffers;
  if (prVar2[lVar5].elements_count * 4 <= iVar3 + prVar2[lVar5].v_counter) {
    rf_gfx_draw();
  }
  local_78 = (float)start_angle;
  rf_gfx_begin(RF_LINES);
  local_48 = color.g;
  fStack_64 = center.y;
  w = color.a;
  z = color.b;
  x = color.r;
  local_68 = center.x;
  if (iVar4 != 0) {
    rf_gfx_color4ub(x,local_48,z,w);
    rf_gfx_vertex3f(local_68,fStack_64,((rf__ctx->field_0).current_batch)->current_depth);
    fVar7 = sinf(local_78 * 0.017453292);
    fVar8 = cosf(local_78 * 0.017453292);
    rf_gfx_vertex3f(fVar7 * fVar9 + local_68,fVar8 * fVar9 + fStack_64,
                    ((rf__ctx->field_0).current_batch)->current_depth);
  }
  if (0 < segments) {
    lVar5 = (long)segments;
    do {
      rf_gfx_color4ub(x,local_48,z,w);
      fVar7 = sinf(local_78 * 0.017453292);
      fVar8 = cosf(local_78 * 0.017453292);
      rf_gfx_vertex3f(fVar7 * fVar9 + local_68,fVar8 * fVar9 + fStack_64,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      local_78 = local_78 + (float)(iVar6 - start_angle) / (float)segments;
      fVar7 = sinf(local_78 * 0.017453292);
      fVar8 = cosf(local_78 * 0.017453292);
      rf_gfx_vertex3f(fVar7 * fVar9 + local_68,fVar8 * fVar9 + fStack_64,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  if (iVar4 != 0) {
    rf_gfx_color4ub(x,local_48,z,w);
    rf_gfx_vertex3f(local_68,fStack_64,((rf__ctx->field_0).current_batch)->current_depth);
    fVar7 = sinf(local_78 * 0.017453292);
    fVar8 = cosf(local_78 * 0.017453292);
    rf_gfx_vertex3f(fVar7 * fVar9 + local_68,fVar9 * fVar8 + fStack_64,
                    ((rf__ctx->field_0).current_batch)->current_depth);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector_lines(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero issue

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;

    // Hide the cap lines when the circle is full
    bool show_cap_lines = true;
    int limit = 2*(segments + 2);
    if ((end_angle - start_angle)%360 == 0) { limit = 2*segments; show_cap_lines = false; }

    if (rf_gfx_check_buffer_limit(limit)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
    }

    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }

    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
    }
    rf_gfx_end();
}